

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SignExtLowering.cpp
# Opt level: O2

Pass * wasm::createSignExtLoweringPass(void)

{
  Pass *this;
  
  this = (Pass *)operator_new(0x130);
  memset(this,0,0x130);
  SignExtLowering::SignExtLowering((SignExtLowering *)this);
  return this;
}

Assistant:

Pass* createSignExtLoweringPass() { return new SignExtLowering(); }